

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.h
# Opt level: O1

LinkedToken * __thiscall Linker::searchForLink(Linker *this,Token *token)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  const_iterator cVar5;
  LinkedToken *pLVar6;
  LinkedToken linkedToken;
  string link;
  string local_128;
  Type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  undefined8 local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  Type local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  LinkedToken local_78;
  
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->namespaceLinks)._M_t,&token->content);
  if ((_Rb_tree_header *)cVar5._M_node != &(this->namespaceLinks)._M_t._M_impl.super__Rb_tree_header
     ) {
    std::__cxx11::string::_M_assign((string *)&local_e0);
  }
  if (local_e0._M_string_length == 0) {
    SymbolIndexSearch::operator()[abi_cxx11_(&local_128,&this->symbolSearch,token);
    std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_e0._M_string_length == 0) {
    EngineSearch::operator()[abi_cxx11_(&local_128,&this->engineSearch,token);
    std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_e0._M_string_length == 0) {
    HeaderSearch::operator()[abi_cxx11_(&local_128,&this->headerSearch,token);
    std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_e0._M_string_length == 0) {
    pLVar6 = (LinkedToken *)0x0;
  }
  else {
    pcVar4 = (token->content)._M_dataplus._M_p;
    local_c0 = &local_b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar4,pcVar4 + (token->content)._M_string_length);
    local_a0 = token->type;
    std::operator+(&local_98,"https://en.cppreference.com",&local_e0);
    local_78.link._M_string_length = local_98._M_string_length;
    local_78.token.content._M_string_length = local_b8;
    paVar1 = &local_128.field_2;
    if (local_c0 == &local_b0) {
      local_128.field_2._8_8_ = local_b0._8_8_;
      local_128._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_128._M_dataplus._M_p = (pointer)local_c0;
    }
    local_128.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
    local_128.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) {
      local_f0._8_8_ = local_98.field_2._8_8_;
      local_100 = &local_f0;
    }
    else {
      local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p;
    }
    local_f0._M_allocated_capacity._1_7_ = local_98.field_2._M_allocated_capacity._1_7_;
    local_f0._M_local_buf[0] = local_98.field_2._M_local_buf[0];
    local_98.field_2._M_local_buf[0] = '\0';
    local_98._M_string_length = 0;
    local_b0._M_local_buf[0] = '\0';
    local_b8 = 0;
    local_108 = local_a0;
    paVar2 = &local_78.token.content.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p == paVar1) {
      local_78.token.content.field_2._8_8_ = local_128.field_2._8_8_;
      local_78.token.content._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_78.token.content._M_dataplus._M_p = local_128._M_dataplus._M_p;
    }
    local_78.token.content.field_2._M_allocated_capacity = local_128.field_2._M_allocated_capacity;
    paVar3 = &local_78.link.field_2;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity =
         (ulong)(uint7)local_b0._M_allocated_capacity._1_7_ << 8;
    local_78.token.type = local_a0;
    if (local_100 == &local_f0) {
      local_78.link.field_2._8_8_ = local_f0._8_8_;
      local_78.link._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_78.link._M_dataplus._M_p = (pointer)local_100;
    }
    local_78.link.field_2._M_allocated_capacity = local_f0._M_allocated_capacity;
    local_f8 = 0;
    local_f0._M_allocated_capacity = (ulong)(uint7)local_98.field_2._M_allocated_capacity._1_7_ << 8
    ;
    local_128._M_dataplus._M_p = (pointer)paVar1;
    local_100 = &local_f0;
    local_c0 = &local_b0;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    pLVar6 = Cache<LinkedToken>::add(&this->tokenCache,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.link._M_dataplus._M_p != paVar3) {
      operator_delete(local_78.link._M_dataplus._M_p,local_78.link.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.token.content._M_dataplus._M_p != paVar2) {
      operator_delete(local_78.token.content._M_dataplus._M_p,
                      local_78.token.content.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  return pLVar6;
}

Assistant:

LinkedToken* searchForLink(const Token& token) {
			std::string link;

			const auto namespaceLink = namespaceLinks.find(token.content);
			if (namespaceLink != namespaceLinks.end()) {
				link = namespaceLink->second;
			}

			if (link.empty()) {
				link = symbolSearch(token);
			}

			if (link.empty()) {
				link = engineSearch(token);
			}

			if (link.empty()) {
				link = headerSearch(token);
			}

			if (link.empty()) {
				return nullptr;
			}

			LinkedToken linkedToken(token, "https://en.cppreference.com" + link);
			return tokenCache.add(std::move(linkedToken));
		}